

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O0

int get_old(char *dir,FileName *varray,char *afile,char *vfile)

{
  int iVar1;
  ulong uVar2;
  char *local_30e8;
  char *lf_cp2_5;
  char *lf_cp1_5;
  FileName *centry_2;
  char *lf_cp2_4;
  char *lf_cp1_4;
  char *lf_cp2_3;
  char *lf_cp1_3;
  FileName *centry_1;
  char *lf_cp2_2;
  char *lf_cp1_2;
  char *lf_cp2_1;
  char *lf_cp1_1;
  FileName *centry;
  char *lf_cp2;
  char *lf_cp1;
  FileName *entry;
  uint local_3060;
  int highest_p;
  uint max_no;
  uint ver_no;
  char vbuf [16];
  char ver [16];
  char to_file [4096];
  char vless [4096];
  char name [4096];
  char *vfile_local;
  char *afile_local;
  FileName *varray_local;
  char *dir_local;
  
  if (varray->version_no == 0xffffffff) {
    dir_local._4_4_ = 0;
  }
  else {
    strcpy(vless + 0xff8,afile);
    separate_version(vless + 0xff8,vbuf + 8,1);
    iVar1 = get_versionless(varray,to_file + 0xff8,dir);
    if (iVar1 == 0) {
      if (vbuf[8] == '\0') {
        local_3060 = varray->version_no;
        lf_cp2 = dir;
        for (centry = (FileName *)dir; centry->name[0] != '\0';
            centry = (FileName *)(centry->name + 1)) {
          if (centry->name[0] == '/') {
            lf_cp2 = centry->name;
          }
        }
        if (lf_cp2 == (char *)((long)&centry[-1].version_no + 3)) {
          if (lf_cp2 == dir) {
            strcpy(afile,"/");
            strcat(afile,varray->name);
          }
          else {
            strcpy(afile,dir);
            strcat(afile,varray->name);
          }
        }
        else {
          strcpy(afile,dir);
          strcat(afile,"/");
          strcat(afile,varray->name);
        }
        strcpy(vfile,afile);
        dir_local._4_4_ = 1;
      }
      else {
        uVar2 = strtoul(vbuf + 8,(char **)0x0,10);
        highest_p = (int)uVar2;
        lf_cp1 = (char *)0x0;
        for (lf_cp1_1 = varray->name; *(int *)(lf_cp1_1 + 0x1000) != -1;
            lf_cp1_1 = lf_cp1_1 + 0x1004) {
          if (*(int *)(lf_cp1_1 + 0x1000) == highest_p) {
            lf_cp1 = lf_cp1_1;
            break;
          }
        }
        lf_cp1_2 = dir;
        lf_cp2_1 = dir;
        if (lf_cp1 == (char *)0x0) {
          dir_local._4_4_ = 0;
        }
        else {
          for (; *lf_cp1_2 != '\0'; lf_cp1_2 = lf_cp1_2 + 1) {
            if (*lf_cp1_2 == '/') {
              lf_cp2_1 = lf_cp1_2;
            }
          }
          if (lf_cp2_1 == lf_cp1_2 + -1) {
            if (lf_cp2_1 == dir) {
              strcpy(afile,"/");
              strcat(afile,lf_cp1);
            }
            else {
              strcpy(afile,dir);
              strcat(afile,lf_cp1);
            }
          }
          else {
            strcpy(afile,dir);
            strcat(afile,"/");
            strcat(afile,lf_cp1);
          }
          strcpy(vfile,afile);
          dir_local._4_4_ = 1;
        }
      }
    }
    else if ((varray->version_no == 0) && (varray[1].version_no == 0xffffffff)) {
      if (vbuf[8] == '\0') {
        strcpy(vfile,to_file + 0xff8);
        strcat(vfile,".~");
        strcat(vfile,"1");
        strcat(vfile,"~");
        strcpy(afile,to_file + 0xff8);
        dir_local._4_4_ = 1;
      }
      else {
        uVar2 = strtoul(vbuf + 8,(char **)0x0,10);
        highest_p = (int)uVar2;
        if (highest_p == 1) {
          strcpy(afile,vless + 0xff8);
          strcat(afile,".~");
          strcat(afile,"1");
          strcat(afile,"~");
          lf_cp2_2 = dir;
          for (centry_1 = (FileName *)dir; centry_1->name[0] != '\0';
              centry_1 = (FileName *)(centry_1->name + 1)) {
            if (centry_1->name[0] == '/') {
              lf_cp2_2 = centry_1->name;
            }
          }
          if (lf_cp2_2 == (char *)((long)&centry_1[-1].version_no + 3)) {
            if (lf_cp2_2 == dir) {
              strcpy(vfile,"/");
              strcat(vfile,afile);
            }
            else {
              strcpy(vfile,dir);
              strcat(vfile,afile);
            }
          }
          else {
            strcpy(vfile,dir);
            strcat(vfile,"/");
            strcat(vfile,afile);
          }
          strcpy(afile,to_file + 0xff8);
          dir_local._4_4_ = 1;
        }
        else {
          dir_local._4_4_ = 0;
        }
      }
    }
    else {
      iVar1 = check_vless_link(to_file + 0xff8,varray,ver + 8,(int *)((long)&entry + 4));
      if (iVar1 == 0) {
        dir_local._4_4_ = 0;
      }
      else if (ver[8] == '\0') {
        if (vbuf[8] == '\0') {
          local_3060 = varray->version_no;
          sprintf((char *)&max_no,"%u",(ulong)(local_3060 + 1));
          if ((char)max_no == '\0') {
            strcpy(vfile,to_file + 0xff8);
          }
          else {
            strcpy(vfile,to_file + 0xff8);
            strcat(vfile,".~");
            strcat(vfile,(char *)&max_no);
            strcat(vfile,"~");
          }
          strcpy(afile,to_file + 0xff8);
          dir_local._4_4_ = 1;
        }
        else {
          uVar2 = strtoul(vbuf + 8,(char **)0x0,10);
          highest_p = (int)uVar2;
          local_3060 = varray->version_no;
          if (highest_p == local_3060 + 1) {
            sprintf((char *)&max_no,"%u",uVar2 & 0xffffffff);
            if ((char)max_no == '\0') {
              strcpy(vfile,to_file + 0xff8);
            }
            else {
              strcpy(vfile,to_file + 0xff8);
              strcat(vfile,".~");
              strcat(vfile,(char *)&max_no);
              strcat(vfile,"~");
            }
            strcpy(afile,to_file + 0xff8);
            dir_local._4_4_ = 1;
          }
          else {
            lf_cp1 = (char *)0x0;
            for (lf_cp1_3 = varray->name; *(int *)(lf_cp1_3 + 0x1000) != -1;
                lf_cp1_3 = lf_cp1_3 + 0x1004) {
              if (*(int *)(lf_cp1_3 + 0x1000) == highest_p) {
                lf_cp1 = lf_cp1_3;
                break;
              }
            }
            lf_cp1_4 = dir;
            lf_cp2_3 = dir;
            if (lf_cp1 == (char *)0x0) {
              dir_local._4_4_ = 0;
            }
            else {
              for (; *lf_cp1_4 != '\0'; lf_cp1_4 = lf_cp1_4 + 1) {
                if (*lf_cp1_4 == '/') {
                  lf_cp2_3 = lf_cp1_4;
                }
              }
              if (lf_cp2_3 == lf_cp1_4 + -1) {
                if (lf_cp2_3 == dir) {
                  strcpy(afile,"/");
                  strcat(afile,lf_cp1);
                }
                else {
                  strcpy(afile,dir);
                  strcat(afile,lf_cp1);
                }
              }
              else {
                strcpy(afile,dir);
                strcat(afile,"/");
                strcat(afile,lf_cp1);
              }
              strcpy(vfile,afile);
              dir_local._4_4_ = 1;
            }
          }
        }
      }
      else if (vbuf[8] == '\0') {
        local_3060 = varray->version_no;
        lf_cp2_4 = dir;
        for (centry_2 = (FileName *)dir; centry_2->name[0] != '\0';
            centry_2 = (FileName *)(centry_2->name + 1)) {
          if (centry_2->name[0] == '/') {
            lf_cp2_4 = centry_2->name;
          }
        }
        if (lf_cp2_4 == (char *)((long)&centry_2[-1].version_no + 3)) {
          if (lf_cp2_4 == dir) {
            strcpy(afile,"/");
            strcat(afile,varray->name);
          }
          else {
            strcpy(afile,dir);
            strcat(afile,varray->name);
          }
        }
        else {
          strcpy(afile,dir);
          strcat(afile,"/");
          strcat(afile,varray->name);
        }
        strcpy(vfile,afile);
        dir_local._4_4_ = 1;
      }
      else {
        uVar2 = strtoul(vbuf + 8,(char **)0x0,10);
        highest_p = (int)uVar2;
        lf_cp1 = (char *)0x0;
        for (lf_cp1_5 = varray->name; *(int *)(lf_cp1_5 + 0x1000) != -1;
            lf_cp1_5 = lf_cp1_5 + 0x1004) {
          if (*(int *)(lf_cp1_5 + 0x1000) == highest_p) {
            lf_cp1 = lf_cp1_5;
            break;
          }
        }
        local_30e8 = dir;
        lf_cp2_5 = dir;
        if (lf_cp1 == (char *)0x0) {
          dir_local._4_4_ = 0;
        }
        else {
          for (; *local_30e8 != '\0'; local_30e8 = local_30e8 + 1) {
            if (*local_30e8 == '/') {
              lf_cp2_5 = local_30e8;
            }
          }
          if (lf_cp2_5 == local_30e8 + -1) {
            if (lf_cp2_5 == dir) {
              strcpy(afile,"/");
              strcat(afile,lf_cp1);
            }
            else {
              strcpy(afile,dir);
              strcat(afile,lf_cp1);
            }
          }
          else {
            strcpy(afile,dir);
            strcat(afile,"/");
            strcat(afile,lf_cp1);
          }
          strcpy(vfile,afile);
          dir_local._4_4_ = 1;
        }
      }
    }
  }
  return dir_local._4_4_;
}

Assistant:

static int get_old(char *dir, FileName *varray, char *afile, char *vfile)
{
  char name[MAXPATHLEN], vless[MAXPATHLEN], to_file[MAXPATHLEN];
  char ver[VERSIONLEN], vbuf[VERSIONLEN];
  unsigned ver_no, max_no;
  int highest_p;
  FileName *entry;

  /* "Old" file have to be existing, thus varray should not be empty. */
  if (NoFileP(varray)) return (0);

  strcpy(name, afile);
  separate_version(name, ver, 1);

  if (get_versionless(varray, vless, dir) == 0) {
    /*
     * There is no versionless file, but at least one versioned
     * file exists.
     */
    if (*ver == '\0') {
      /*
       * No version is specified.  The highest versioned file
       * is an old file.
       */
      FindHighestVersion(varray, entry, max_no);
      ConcDirAndName(dir, entry->name, afile);
      strcpy(vfile, afile);
      return (1);
    } else {
      /*
       * A version is specified.  We have to walk thorough
       * varray and try to find the file with the specified
       * version.
       */
      ver_no = strtoul(ver, (char **)NULL, 10);
      FindSpecifiedVersion(varray, entry, ver_no);
      if (entry != NULL) {
        ConcDirAndName(dir, entry->name, afile);
        strcpy(vfile, afile);
        return (1);
      } else
        return (0);
    }
  } else if (OnlyVersionlessP(varray)) {
    /*
     * There is only versionless file in varray.
     * If the specified version is 1 the versionless file is regarded
     * as version 1 file.
     */
    if (*ver == '\0') {
      /*
       * No version is specified.  The versionless file is dealt
       * with as version 1.
       */
      ConcNameAndVersion(vless, "1", vfile);
      strcpy(afile, vless);
      return (1);
    } else {
      ver_no = strtoul(ver, (char **)NULL, 10);
      if (ver_no == 1) {
        /*
         * Version 1 is specified.  The versionless file is
         * dealt with as a version 1 file.
         */
        ConcNameAndVersion(name, "1", afile);
        ConcDirAndName(dir, afile, vfile);
        strcpy(afile, vless);
        return (1);
      } else {
        /*
         * Other versions than 1 are not recognized as an old
         * file.
         */
        return (0);
      }
    }
  } else {
    if (check_vless_link(vless, varray, to_file, &highest_p) == 0) return (0);
    if (*to_file == '\0') {
      /*
       * There is a versionless file in varray and at least one
       * versioned file exists.  The versionless file is not linked
       * to any file in varray.
       */
      if (*ver == '\0') {
        /*
         * No version is specified.  The one higher than an
         * existing maximum version is dealt with as the
         * old version, and it should be a version of the
         * link missing versionless file.
         */
        FindHighestVersion(varray, entry, max_no);
        sprintf(vbuf, "%u", max_no + 1);
        ConcNameAndVersion(vless, vbuf, vfile);
        strcpy(afile, vless);
        return (1);
      } else {
        /* A version is specified. */
        ver_no = strtoul(ver, (char **)NULL, 10);
        FindHighestVersion(varray, entry, max_no);
        if (ver_no == max_no + 1) {
          /*
           * If the version is one higher than the
           * existing highest version is specified, it
           * is dealt with as a version of the link
           * missing versionless file.
           */
          sprintf(vbuf, "%u", ver_no);
          ConcNameAndVersion(vless, vbuf, vfile);
          strcpy(afile, vless);
          return (1);
        } else {
          /*
           * We have to walk through varray and try
           * to find the file with the specified version.
           */
          FindSpecifiedVersion(varray, entry, ver_no);
          if (entry != NULL) {
            ConcDirAndName(dir, entry->name, afile);
            strcpy(vfile, afile);
            return (1);
          } else
            return (0);
        }
      }
    } else {
      /*
       * There is a versionless file in varray and at least one
       * versioned file exists.  The versionless file is linked to
       * one of files in varray.
       */
      if (*ver == '\0') {
        /*
         * No version is specified.  The highest versioned file
         * in varray is an old file.
         */
        FindHighestVersion(varray, entry, max_no);
        ConcDirAndName(dir, entry->name, afile);
        strcpy(vfile, afile);
        return (1);
      } else {
        /*
         * A version is specified.  We have to walk thorough
         * varray and try to find the file with the specified
         * version.
         */
        ver_no = strtoul(ver, (char **)NULL, 10);
        FindSpecifiedVersion(varray, entry, ver_no);
        if (entry != NULL) {
          ConcDirAndName(dir, entry->name, afile);
          strcpy(vfile, afile);
          return (1);
        } else
          return (0);
      }
    }
  }
}